

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void do_queued_events(void)

{
  int iVar1;
  undefined1 local_c8 [8];
  XEvent xevent;
  
  in_a_window = true;
  while (iVar1 = XEventsQueued(fl_display,1), iVar1 != 0) {
    XNextEvent(fl_display,local_c8);
    iVar1 = fl_send_system_handlers(local_c8);
    if (iVar1 == 0) {
      fl_handle((XEvent *)local_c8);
    }
  }
  if ((in_a_window & 1U) == 0) {
    Fl::handle(4,(Fl_Window *)0x0);
  }
  else if (send_motion == fl_xmousewin) {
    send_motion = (Fl_Window *)0x0;
    Fl::handle(0xb,fl_xmousewin);
  }
  return;
}

Assistant:

static void do_queued_events() {
  in_a_window = true;
  while (XEventsQueued(fl_display,QueuedAfterReading)) {
    XEvent xevent;
    XNextEvent(fl_display, &xevent);
    if (fl_send_system_handlers(&xevent))
      continue;
    fl_handle(xevent);
  }
  // we send FL_LEAVE only if the mouse did not enter some other window:
  if (!in_a_window) Fl::handle(FL_LEAVE, 0);
#if CONSOLIDATE_MOTION
  else if (send_motion == fl_xmousewin) {
    send_motion = 0;
    Fl::handle(FL_MOVE, fl_xmousewin);
  }
#endif
}